

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

int rf_get_size_base64(uchar *input)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  
  iVar1 = 0;
  for (puVar3 = input + 3; puVar3[-3] != '\0'; puVar3 = puVar3 + 4) {
    iVar2 = 3;
    if (*puVar3 == '=') {
      iVar2 = (puVar3[-1] != '=') + 1;
    }
    iVar1 = iVar1 + iVar2;
  }
  return iVar1;
}

Assistant:

RF_API int rf_get_size_base64(const unsigned char *input)
{
    int size = 0;

    for (rf_int i = 0; input[4 * i] != 0; i++)
    {
        if (input[4 * i + 3] == '=')
        {
            if (input[4 * i + 2] == '=') size += 1;
            else size += 2;
        } else size += 3;
    }

    return size;
}